

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string-tree.h
# Opt level: O1

StringTree * __thiscall
kj::StringTree::
concat<kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::StringTree,kj::ArrayPtr<char_const>,kj::CappedArray<char,14ul>,kj::ArrayPtr<char_const>,kj::StringTree,kj::ArrayPtr<char_const>,kj::StringTree,kj::ArrayPtr<char_const>,kj::StringTree,kj::ArrayPtr<char_const>,kj::StringTree,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::StringTree,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::StringTree,kj::StringTree,kj::ArrayPtr<char_const>>
          (StringTree *__return_storage_ptr__,StringTree *this,ArrayPtr<const_char> *params,
          ArrayPtr<const_char> *params_1,ArrayPtr<const_char> *params_2,StringTree *params_3,
          ArrayPtr<const_char> *params_4,CappedArray<char,_14UL> *params_5,
          ArrayPtr<const_char> *params_6,StringTree *params_7,ArrayPtr<const_char> *params_8,
          StringTree *params_9,ArrayPtr<const_char> *params_10,StringTree *params_11,
          ArrayPtr<const_char> *params_12,StringTree *params_13,ArrayPtr<const_char> *params_14,
          ArrayPtr<const_char> *params_15,StringTree *params_16,ArrayPtr<const_char> *params_17,
          ArrayPtr<const_char> *params_18,StringTree *params_19,StringTree *params_20,
          ArrayPtr<const_char> *params_21)

{
  ArrayDisposer *pAVar1;
  Branch *pBVar2;
  long lVar3;
  size_t sVar4;
  char *pcVar5;
  size_t result_2;
  String local_138;
  char *local_118;
  size_t sStack_110;
  size_t local_108;
  char *local_100;
  char *local_f8;
  char *pcStack_f0;
  undefined8 local_e8;
  char *local_e0;
  char *local_d8;
  char *local_d0;
  char *local_c8;
  char *local_c0;
  char *local_b8;
  char *local_b0;
  char *local_a8;
  size_t sStack_a0;
  char *local_98;
  char *local_90;
  size_t sStack_88;
  char *local_80;
  size_t sStack_78;
  char *local_70;
  StringTree *local_68;
  ArrayPtr<const_char> *local_60;
  ArrayPtr<const_char> *local_58;
  StringTree *local_50;
  StringTree *local_48;
  size_t local_40;
  char *local_38;
  
  (__return_storage_ptr__->branches).ptr = (Branch *)0x0;
  (__return_storage_ptr__->branches).size_ = 0;
  (__return_storage_ptr__->text).content.size_ = 0;
  (__return_storage_ptr__->text).content.disposer = (ArrayDisposer *)0x0;
  __return_storage_ptr__->size_ = 0;
  (__return_storage_ptr__->text).content.ptr = (char *)0x0;
  (__return_storage_ptr__->branches).disposer = (ArrayDisposer *)0x0;
  local_38 = (this->text).content.ptr;
  local_118 = local_38;
  local_40 = params->size_;
  sStack_110 = local_40;
  local_108 = params_1->size_;
  local_100 = params_2->ptr;
  local_f8 = (params_3->text).content.ptr;
  pcStack_f0 = params_4->ptr;
  local_e8 = *(undefined8 *)params_5->content;
  local_e0 = params_6->ptr;
  local_d8 = (params_7->text).content.ptr;
  local_d0 = params_8->ptr;
  local_c8 = (params_9->text).content.ptr;
  local_c0 = params_10->ptr;
  local_b8 = (params_11->text).content.ptr;
  local_b0 = params_12->ptr;
  local_a8 = (params_13->text).content.ptr;
  sStack_a0 = params_14->size_;
  local_98 = params_15->ptr;
  local_90 = (params_16->text).content.ptr;
  sStack_88 = params_17->size_;
  local_80 = params_18->ptr;
  sStack_78 = params_19->size_;
  local_70 = (params_20->text).content.ptr;
  sVar4 = 0;
  lVar3 = 0;
  do {
    sVar4 = sVar4 + *(long *)((long)&local_118 + lVar3);
    lVar3 = lVar3 + 8;
  } while (lVar3 != 0xb0);
  __return_storage_ptr__->size_ = sVar4;
  sVar4 = 0;
  local_100 = (char *)0x0;
  local_e0 = (char *)0x0;
  local_d0 = (char *)0x0;
  local_c0 = (char *)0x0;
  local_b0 = (char *)0x0;
  local_98 = (char *)0x0;
  local_80 = (char *)0x0;
  sStack_78 = 0;
  lVar3 = 0;
  do {
    sVar4 = sVar4 + *(long *)((long)&local_118 + lVar3);
    lVar3 = lVar3 + 8;
  } while (lVar3 != 0xb0);
  local_68 = this;
  local_60 = params;
  local_58 = params_1;
  local_50 = params_3;
  local_48 = (StringTree *)params_2;
  heapString(&local_138,sVar4);
  pcVar5 = (__return_storage_ptr__->text).content.ptr;
  if (pcVar5 != (char *)0x0) {
    sVar4 = (__return_storage_ptr__->text).content.size_;
    (__return_storage_ptr__->text).content.ptr = (char *)0x0;
    (__return_storage_ptr__->text).content.size_ = 0;
    pAVar1 = (__return_storage_ptr__->text).content.disposer;
    (**pAVar1->_vptr_ArrayDisposer)(pAVar1,pcVar5,1,sVar4,sVar4,0);
  }
  (__return_storage_ptr__->text).content.ptr = local_138.content.ptr;
  (__return_storage_ptr__->text).content.size_ = local_138.content.size_;
  (__return_storage_ptr__->text).content.disposer = local_138.content.disposer;
  sVar4 = 0;
  local_108 = 0;
  local_118 = (char *)0x0;
  sStack_110 = 0;
  local_100 = (char *)0x1;
  local_f8 = (char *)0x0;
  pcStack_f0 = (char *)0x0;
  local_e8 = 0;
  local_e0 = (char *)0x1;
  local_d8 = (char *)0x0;
  local_d0 = (char *)0x1;
  local_c8 = (char *)0x0;
  local_c0 = (char *)0x1;
  local_b8 = (char *)0x0;
  local_b0 = (char *)0x1;
  local_a8 = (char *)0x0;
  sStack_a0 = 0;
  local_98 = (char *)0x1;
  local_90 = (char *)0x0;
  sStack_88 = 0;
  local_80 = (char *)0x1;
  sStack_78 = 1;
  local_70 = (char *)0x0;
  lVar3 = 0;
  do {
    sVar4 = sVar4 + *(long *)((long)&local_118 + lVar3);
    lVar3 = lVar3 + 8;
  } while (lVar3 != 0xb0);
  local_138.content.ptr =
       (char *)_::HeapArrayDisposer::allocateImpl
                         (0x40,sVar4,sVar4,
                          _::HeapArrayDisposer::Allocate_<kj::StringTree::Branch,_false,_false>::
                          construct,
                          _::HeapArrayDisposer::Allocate_<kj::StringTree::Branch,_false,_false>::
                          destruct);
  local_138.content.disposer = (ArrayDisposer *)&_::HeapArrayDisposer::instance;
  pBVar2 = (__return_storage_ptr__->branches).ptr;
  local_138.content.size_ = sVar4;
  if (pBVar2 != (Branch *)0x0) {
    sVar4 = (__return_storage_ptr__->branches).size_;
    (__return_storage_ptr__->branches).ptr = (Branch *)0x0;
    (__return_storage_ptr__->branches).size_ = 0;
    pAVar1 = (__return_storage_ptr__->branches).disposer;
    (**pAVar1->_vptr_ArrayDisposer)
              (pAVar1,pBVar2,0x40,sVar4,sVar4,
               ArrayDisposer::Dispose_<kj::StringTree::Branch,_false>::destruct);
  }
  (__return_storage_ptr__->branches).ptr = (Branch *)local_138.content.ptr;
  (__return_storage_ptr__->branches).size_ = local_138.content.size_;
  (__return_storage_ptr__->branches).disposer = local_138.content.disposer;
  pcVar5 = (char *)(__return_storage_ptr__->text).content.size_;
  if (pcVar5 != (char *)0x0) {
    pcVar5 = (__return_storage_ptr__->text).content.ptr;
  }
  fill<kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::StringTree,kj::ArrayPtr<char_const>,kj::CappedArray<char,14ul>,kj::ArrayPtr<char_const>,kj::StringTree,kj::ArrayPtr<char_const>,kj::StringTree,kj::ArrayPtr<char_const>,kj::StringTree,kj::ArrayPtr<char_const>,kj::StringTree,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::StringTree,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::StringTree,kj::StringTree,kj::ArrayPtr<char_const>>
            (__return_storage_ptr__,pcVar5,0,(ArrayPtr<const_char> *)local_68,local_60,local_58,
             local_48,(ArrayPtr<const_char> *)local_50,(CappedArray<char,_14UL> *)params_4,
             (ArrayPtr<const_char> *)params_5,(StringTree *)params_6,
             (ArrayPtr<const_char> *)params_7,(StringTree *)params_8,
             (ArrayPtr<const_char> *)params_9,(StringTree *)params_10,
             (ArrayPtr<const_char> *)params_11,(StringTree *)params_12,
             (ArrayPtr<const_char> *)params_13,params_14,(StringTree *)params_15,
             (ArrayPtr<const_char> *)params_16,params_17,(StringTree *)params_18,params_19,
             (ArrayPtr<const_char> *)params_20);
  return __return_storage_ptr__;
}

Assistant:

StringTree StringTree::concat(Params&&... params) {
  StringTree result;
  result.size_ = _::sum({params.size()...});
  result.text = heapString(
      _::sum({StringTree::flatSize(kj::fwd<Params>(params))...}));
  result.branches = heapArray<StringTree::Branch>(
      _::sum({StringTree::branchCount(kj::fwd<Params>(params))...}));
  result.fill(result.text.begin(), 0, kj::fwd<Params>(params)...);
  return result;
}